

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::UngroupedAggregateState::UngroupedAggregateState
          (UngroupedAggregateState *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *aggregate_expressions)

{
  pointer *ppoVar1;
  pointer *ppp_Var2;
  iterator __position;
  iterator __position_00;
  ulong uVar3;
  _Head_base<0UL,_std::atomic<unsigned_long>_*,_false> __s;
  const_reference this_00;
  pointer this_01;
  BoundAggregateExpression *pBVar4;
  idx_t iVar5;
  size_type __n;
  aggregate_destructor_t *__args;
  ulong __n_00;
  _Head_base<0UL,_unsigned_char_*,_false> local_50;
  vector<duckdb::optional_ptr<duckdb::FunctionData,true>,std::allocator<duckdb::optional_ptr<duckdb::FunctionData,true>>>
  *local_48;
  vector<void(*)(duckdb::Vector&,duckdb::AggregateInputData&,unsigned_long),std::allocator<void(*)(duckdb::Vector&,duckdb::AggregateInputData&,unsigned_long)>>
  *local_40;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_38;
  
  this->aggregate_expressions = aggregate_expressions;
  (this->aggregate_data).
  super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aggregate_data).
  super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aggregate_data).
  super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bind_data).
  super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bind_data).
  super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bind_data).
  super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->destructors).
  super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  .
  super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->destructors).
  super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  .
  super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->destructors).
  super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  .
  super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->counts).
  super_unique_ptr<std::atomic<unsigned_long>[],_std::default_delete<std::atomic<unsigned_long>[]>_>
  ._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_long>,_std::default_delete<std::atomic<unsigned_long>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl =
       (atomic<unsigned_long> *)0x0;
  uVar3 = (long)(aggregate_expressions->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(aggregate_expressions->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (vector<duckdb::optional_ptr<duckdb::FunctionData,true>,std::allocator<duckdb::optional_ptr<duckdb::FunctionData,true>>>
              *)&this->bind_data;
  __n_00 = 0xffffffffffffffff;
  if (-1 < (long)uVar3) {
    __n_00 = uVar3;
  }
  __s._M_head_impl = (atomic<unsigned_long> *)operator_new__(__n_00);
  switchD_01043a80::default(__s._M_head_impl,0,__n_00);
  (this->counts).
  super_unique_ptr<std::atomic<unsigned_long>[],_std::default_delete<std::atomic<unsigned_long>[]>_>
  ._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_long>,_std::default_delete<std::atomic<unsigned_long>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl = __s._M_head_impl;
  if ((aggregate_expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (aggregate_expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_40 = (vector<void(*)(duckdb::Vector&,duckdb::AggregateInputData&,unsigned_long),std::allocator<void(*)(duckdb::Vector&,duckdb::AggregateInputData&,unsigned_long)>>
                *)&this->destructors;
    __n = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](aggregate_expressions,__n);
      this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_00);
      pBVar4 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                         (&this_01->super_BaseExpression);
      iVar5 = (*(pBVar4->function).state_size)(&pBVar4->function);
      local_50._M_head_impl = (uchar *)operator_new__(iVar5);
      (*(pBVar4->function).initialize)(&pBVar4->function,local_50._M_head_impl);
      ::std::
      vector<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>,std::allocator<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>>>
      ::emplace_back<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>>
                ((vector<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>,std::allocator<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>>>
                  *)&this->aggregate_data,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> *)&local_50
                );
      local_38._M_head_impl =
           (pBVar4->bind_info).
           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      __position._M_current =
           (this->bind_data).
           super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
           .
           super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->bind_data).
          super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
          .
          super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<duckdb::optional_ptr<duckdb::FunctionData,true>,std::allocator<duckdb::optional_ptr<duckdb::FunctionData,true>>>
        ::_M_realloc_insert<duckdb::optional_ptr<duckdb::FunctionData,true>>
                  (local_48,__position,(optional_ptr<duckdb::FunctionData,_true> *)&local_38);
      }
      else {
        (__position._M_current)->ptr = local_38._M_head_impl;
        ppoVar1 = &(this->bind_data).
                   super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
                   .
                   super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppoVar1 = *ppoVar1 + 1;
      }
      __args = &(pBVar4->function).destructor;
      __position_00._M_current =
           (this->destructors).
           super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
           .
           super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->destructors).
          super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
          .
          super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<void(*)(duckdb::Vector&,duckdb::AggregateInputData&,unsigned_long),std::allocator<void(*)(duckdb::Vector&,duckdb::AggregateInputData&,unsigned_long)>>
        ::
        _M_realloc_insert<void(*const&)(duckdb::Vector&,duckdb::AggregateInputData&,unsigned_long)>
                  (local_40,__position_00,
                   (_func_void_Vector_ptr_AggregateInputData_ptr_unsigned_long **)__args);
      }
      else {
        *__position_00._M_current =
             (_func_void_Vector_ptr_AggregateInputData_ptr_unsigned_long *)*__args;
        ppp_Var2 = &(this->destructors).
                    super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
                    .
                    super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *ppp_Var2 = *ppp_Var2 + 1;
      }
      if (local_50._M_head_impl != (data_ptr_t)0x0) {
        operator_delete__(local_50._M_head_impl);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(aggregate_expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(aggregate_expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

UngroupedAggregateState::UngroupedAggregateState(const vector<unique_ptr<Expression>> &aggregate_expressions)
    : aggregate_expressions(aggregate_expressions) {
	counts = make_uniq_array<atomic<idx_t>>(aggregate_expressions.size());
	for (idx_t i = 0; i < aggregate_expressions.size(); i++) {
		auto &aggregate = aggregate_expressions[i];
		D_ASSERT(aggregate->GetExpressionClass() == ExpressionClass::BOUND_AGGREGATE);
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		auto state = make_unsafe_uniq_array_uninitialized<data_t>(aggr.function.state_size(aggr.function));
		aggr.function.initialize(aggr.function, state.get());
		aggregate_data.push_back(std::move(state));
		bind_data.push_back(aggr.bind_info.get());
		destructors.push_back(aggr.function.destructor);
#ifdef DEBUG
		counts[i] = 0;
#endif
	}
}